

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O2

void __thiscall draco::PointAttribute::PointAttribute(PointAttribute *this,GeometryAttribute *att)

{
  DataBuffer *pDVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  Type TVar5;
  uint32_t uVar6;
  bool bVar7;
  undefined7 uVar8;
  uint8_t uVar9;
  undefined3 uVar10;
  DataType DVar11;
  
  pDVar1 = att->buffer_;
  iVar2 = (att->buffer_descriptor_).buffer_id;
  iVar3 = (att->buffer_descriptor_).buffer_update_count;
  uVar9 = att->num_components_;
  uVar10 = *(undefined3 *)&att->field_0x19;
  DVar11 = att->data_type_;
  bVar7 = att->normalized_;
  uVar8 = *(undefined7 *)&att->field_0x21;
  iVar4 = att->byte_stride_;
  TVar5 = att->attribute_type_;
  uVar6 = att->unique_id_;
  (this->super_GeometryAttribute).byte_offset_ = att->byte_offset_;
  (this->super_GeometryAttribute).attribute_type_ = TVar5;
  (this->super_GeometryAttribute).unique_id_ = uVar6;
  (this->super_GeometryAttribute).normalized_ = bVar7;
  *(undefined7 *)&(this->super_GeometryAttribute).field_0x21 = uVar8;
  (this->super_GeometryAttribute).byte_stride_ = iVar4;
  (this->super_GeometryAttribute).buffer_descriptor_.buffer_update_count = iVar3;
  (this->super_GeometryAttribute).num_components_ = uVar9;
  *(undefined3 *)&(this->super_GeometryAttribute).field_0x19 = uVar10;
  (this->super_GeometryAttribute).data_type_ = DVar11;
  (this->super_GeometryAttribute).buffer_ = pDVar1;
  (this->super_GeometryAttribute).buffer_descriptor_.buffer_id = iVar2;
  (this->attribute_transform_data_)._M_t.
  super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
  .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl =
       (AttributeTransformData *)0x0;
  (this->attribute_buffer_)._M_t.
  super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
  super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
  super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl = (DataBuffer *)0x0;
  (this->indices_map_).vector_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->indices_map_).vector_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indices_map_).vector_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->indices_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
  return;
}

Assistant:

PointAttribute::PointAttribute(const GeometryAttribute &att)
    : GeometryAttribute(att),
      num_unique_entries_(0),
      identity_mapping_(false) {}